

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockedpool.cpp
# Opt level: O1

void __thiscall Arena::free(Arena *this,void *__ptr)

{
  ulong uVar1;
  long lVar2;
  _Hash_node_base *p_Var3;
  iterator iVar4;
  mapped_type *pmVar5;
  runtime_error *this_00;
  _Hash_node_base *p_Var6;
  ulong uVar7;
  _Node_iterator_base<std::pair<void_*const,_unsigned_long>,_false> __it;
  __node_base_ptr p_Var8;
  __node_base_ptr p_Var9;
  _Node_iterator_base<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>,_false>
  _Var10;
  long in_FS_OFFSET;
  pair<char_*,_unsigned_long> freed;
  _Hash_node_base *local_48;
  _Hash_node_base *local_40;
  unsigned_long uStack_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (__ptr != (void *)0x0) {
    uVar1 = (this->chunks_used)._M_h._M_bucket_count;
    uVar7 = (ulong)__ptr % uVar1;
    p_Var8 = (this->chunks_used)._M_h._M_buckets[uVar7];
    p_Var9 = (__node_base_ptr)0x0;
    if ((p_Var8 != (__node_base_ptr)0x0) &&
       (p_Var6 = p_Var8->_M_nxt, p_Var9 = p_Var8,
       p_Var8->_M_nxt[1]._M_nxt != (_Hash_node_base *)__ptr)) {
      while (p_Var8 = p_Var6, p_Var6 = p_Var8->_M_nxt, p_Var6 != (_Hash_node_base *)0x0) {
        p_Var9 = (__node_base_ptr)0x0;
        if (((ulong)p_Var6[1]._M_nxt % uVar1 != uVar7) ||
           (p_Var9 = p_Var8, p_Var6[1]._M_nxt == (_Hash_node_base *)__ptr)) goto LAB_00171e55;
      }
      p_Var9 = (__node_base_ptr)0x0;
    }
LAB_00171e55:
    if (p_Var9 == (__node_base_ptr)0x0) {
      __it._M_cur = (__node_type *)0x0;
    }
    else {
      __it._M_cur = (__node_type *)p_Var9->_M_nxt;
    }
    if (__it._M_cur == (__node_type *)0x0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Arena: invalid or double free");
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00172094;
    }
    local_40 = *(_Hash_node_base **)((long)__it._M_cur + 8);
    uStack_38 = *(unsigned_long *)((long)__it._M_cur + 0x10);
    std::
    _Hashtable<void_*,_std::pair<void_*const,_unsigned_long>,_std::allocator<std::pair<void_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::erase(&(this->chunks_used)._M_h,(const_iterator)__it._M_cur);
    uVar1 = (this->chunks_free_end)._M_h._M_bucket_count;
    uVar7 = (ulong)local_40 % uVar1;
    p_Var8 = (this->chunks_free_end)._M_h._M_buckets[uVar7];
    p_Var9 = (__node_base_ptr)0x0;
    if ((p_Var8 != (__node_base_ptr)0x0) &&
       (p_Var6 = p_Var8->_M_nxt, p_Var9 = p_Var8, local_40 != p_Var8->_M_nxt[1]._M_nxt)) {
      while (p_Var8 = p_Var6, p_Var6 = p_Var8->_M_nxt, p_Var6 != (_Hash_node_base *)0x0) {
        p_Var9 = (__node_base_ptr)0x0;
        if (((ulong)p_Var6[1]._M_nxt % uVar1 != uVar7) ||
           (p_Var9 = p_Var8, local_40 == p_Var6[1]._M_nxt)) goto LAB_00171ede;
      }
      p_Var9 = (__node_base_ptr)0x0;
    }
LAB_00171ede:
    if (p_Var9 == (__node_base_ptr)0x0) {
      _Var10._M_cur = (__node_type *)0x0;
    }
    else {
      _Var10._M_cur = (__node_type *)p_Var9->_M_nxt;
    }
    if (_Var10._M_cur != (__node_type *)0x0) {
      lVar2 = *(long *)(*(_Base_ptr *)((long)_Var10._M_cur + 0x10) + 1);
      local_40 = (_Hash_node_base *)((long)local_40 - lVar2);
      uStack_38 = uStack_38 + lVar2;
      std::
      _Rb_tree<unsigned_long,std::pair<unsigned_long_const,void*>,std::_Select1st<std::pair<unsigned_long_const,void*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,void*>>>
      ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,void*>,std::_Select1st<std::pair<unsigned_long_const,void*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,void*>>>
                          *)&this->size_to_free_chunk,*(_Base_ptr *)((long)_Var10._M_cur + 0x10));
      std::
      _Hashtable<void_*,_std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>,_std::allocator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::erase(&(this->chunks_free_end)._M_h,(const_iterator)_Var10._M_cur);
    }
    p_Var6 = (_Hash_node_base *)((long)&local_40->_M_nxt + uStack_38);
    uVar1 = (this->chunks_free)._M_h._M_bucket_count;
    uVar7 = (ulong)p_Var6 % uVar1;
    p_Var8 = (this->chunks_free)._M_h._M_buckets[uVar7];
    p_Var9 = (__node_base_ptr)0x0;
    if ((p_Var8 != (__node_base_ptr)0x0) &&
       (p_Var3 = p_Var8->_M_nxt, p_Var9 = p_Var8, p_Var6 != p_Var8->_M_nxt[1]._M_nxt)) {
      while (p_Var8 = p_Var3, p_Var3 = p_Var8->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
        p_Var9 = (__node_base_ptr)0x0;
        if (((ulong)p_Var3[1]._M_nxt % uVar1 != uVar7) ||
           (p_Var9 = p_Var8, p_Var6 == p_Var3[1]._M_nxt)) goto LAB_00171f84;
      }
      p_Var9 = (__node_base_ptr)0x0;
    }
LAB_00171f84:
    if (p_Var9 == (__node_base_ptr)0x0) {
      _Var10._M_cur = (__node_type *)0x0;
    }
    else {
      _Var10._M_cur = (__node_type *)p_Var9->_M_nxt;
    }
    if (_Var10._M_cur != (__node_type *)0x0) {
      uStack_38 = uStack_38 + *(long *)(*(_Base_ptr *)((long)_Var10._M_cur + 0x10) + 1);
      std::
      _Rb_tree<unsigned_long,std::pair<unsigned_long_const,void*>,std::_Select1st<std::pair<unsigned_long_const,void*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,void*>>>
      ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,void*>,std::_Select1st<std::pair<unsigned_long_const,void*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,void*>>>
                          *)&this->size_to_free_chunk,*(_Base_ptr *)((long)_Var10._M_cur + 0x10));
      std::
      _Hashtable<void_*,_std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>,_std::allocator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::erase(&(this->chunks_free)._M_h,(const_iterator)_Var10._M_cur);
    }
    iVar4 = std::
            _Rb_tree<unsigned_long,std::pair<unsigned_long_const,void*>,std::_Select1st<std::pair<unsigned_long_const,void*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,void*>>>
            ::_M_emplace_equal<unsigned_long&,char*&>
                      ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,void*>,std::_Select1st<std::pair<unsigned_long_const,void*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,void*>>>
                        *)&this->size_to_free_chunk,&uStack_38,(char **)&local_40);
    local_48 = local_40;
    pmVar5 = std::__detail::
             _Map_base<void_*,_std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>,_std::allocator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<void_*,_std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>,_std::allocator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->chunks_free,&local_48);
    pmVar5->_M_node = iVar4._M_node;
    local_48 = (_Hash_node_base *)((long)&local_40->_M_nxt + uStack_38);
    pmVar5 = std::__detail::
             _Map_base<void_*,_std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>,_std::allocator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<void_*,_std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>,_std::allocator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->chunks_free_end,&local_48);
    pmVar5->_M_node = iVar4._M_node;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_00172094:
  __stack_chk_fail();
}

Assistant:

void Arena::free(void *ptr)
{
    // Freeing the nullptr pointer is OK.
    if (ptr == nullptr) {
        return;
    }

    // Remove chunk from used map
    auto i = chunks_used.find(ptr);
    if (i == chunks_used.end()) {
        throw std::runtime_error("Arena: invalid or double free");
    }
    auto freed = std::make_pair(static_cast<char*>(i->first), i->second);
    chunks_used.erase(i);

    // coalesce freed with previous chunk
    auto prev = chunks_free_end.find(freed.first);
    if (prev != chunks_free_end.end()) {
        freed.first -= prev->second->first;
        freed.second += prev->second->first;
        size_to_free_chunk.erase(prev->second);
        chunks_free_end.erase(prev);
    }

    // coalesce freed with chunk after freed
    auto next = chunks_free.find(freed.first + freed.second);
    if (next != chunks_free.end()) {
        freed.second += next->second->first;
        size_to_free_chunk.erase(next->second);
        chunks_free.erase(next);
    }

    // Add/set space with coalesced free chunk
    auto it = size_to_free_chunk.emplace(freed.second, freed.first);
    chunks_free[freed.first] = it;
    chunks_free_end[freed.first + freed.second] = it;
}